

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseEnumStmt(Parser *this)

{
  bool bVar1;
  Parser *in_RSI;
  byte local_202;
  undefined1 local_1d8 [16];
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  value_type local_180;
  allocator<char> local_141;
  string local_140 [32];
  undefined1 local_120 [8];
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> variantType;
  Token variantName;
  string local_e0;
  undefined1 local_c0 [8];
  vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_> variants;
  string local_a0;
  undefined1 local_80 [8];
  Token name;
  allocator<char> local_39;
  string local_38;
  Parser *this_local;
  
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Expected enum name.",&local_39);
  expect(in_RSI,IDENTIFIER,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  Token::Token((Token *)local_80,&in_RSI->m_previous);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"Expected \'{\' before enum body.",
             (allocator<char> *)
             ((long)&variants.
                     super__Vector_base<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  expect(in_RSI,LEFT_BRACE,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&variants.
                     super__Vector_base<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>::vector
            ((vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_> *)local_c0
            );
  while( true ) {
    bVar1 = check(in_RSI,RIGHT_BRACE);
    local_202 = 0;
    if (!bVar1) {
      bVar1 = isAtEnd(in_RSI);
      local_202 = bVar1 ^ 0xff;
    }
    if ((local_202 & 1) == 0) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Expected variant declaration in struct body.",
               (allocator<char> *)&variantName.field_0x2f);
    expect(in_RSI,IDENTIFIER,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&variantName.field_0x2f);
    Token::Token((Token *)&variantType,&in_RSI->m_previous);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_140,"Expected typename after variant name.",&local_141);
    expectTypename((Parser *)local_120,(string *)in_RSI,SUB81(local_140,0));
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator(&local_141);
    Token::Token(&local_180.name,(Token *)&variantType);
    std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::unique_ptr
              (&local_180.typename_,
               (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               local_120);
    std::vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>::push_back
              ((vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_> *)
               local_c0,&local_180);
    EnumStmt::Variant::~Variant(&local_180);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"Expected \';\' after enum variant declaration.",&local_1a1);
    expect(in_RSI,SEMICOLON,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::~unique_ptr
              ((unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               local_120);
    Token::~Token((Token *)&variantType);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"Expected \'}\' after enum body.",
             (allocator<char> *)(local_1d8 + 0xf));
  expect(in_RSI,RIGHT_BRACE,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)(local_1d8 + 0xf));
  std::
  make_unique<enact::EnumStmt,enact::Token,std::vector<enact::EnumStmt::Variant,std::allocator<enact::EnumStmt::Variant>>>
            ((Token *)local_1d8,
             (vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_> *)local_80
            );
  std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>::
  unique_ptr<enact::EnumStmt,std::default_delete<enact::EnumStmt>,void>
            ((unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>> *)this,
             (unique_ptr<enact::EnumStmt,_std::default_delete<enact::EnumStmt>_> *)local_1d8);
  std::unique_ptr<enact::EnumStmt,_std::default_delete<enact::EnumStmt>_>::~unique_ptr
            ((unique_ptr<enact::EnumStmt,_std::default_delete<enact::EnumStmt>_> *)local_1d8);
  std::vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>::~vector
            ((vector<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_> *)local_c0
            );
  Token::~Token((Token *)local_80);
  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseEnumStmt() {
        expect(TokenType::IDENTIFIER, "Expected enum name.");
        Token name = m_previous;

        expect(TokenType::LEFT_BRACE, "Expected '{' before enum body.");

        std::vector<EnumStmt::Variant> variants;

        while (!check(TokenType::RIGHT_BRACE) && !isAtEnd()) {
            expect(TokenType::IDENTIFIER, "Expected variant declaration in struct body.");
            // Field declaration
            Token variantName = m_previous;
            std::unique_ptr<const Typename> variantType = expectTypename("Expected typename after variant name.", true);

            variants.push_back(EnumStmt::Variant{std::move(variantName), std::move(variantType)});

            expect(TokenType::SEMICOLON, "Expected ';' after enum variant declaration.");
        }

        expect(TokenType::RIGHT_BRACE, "Expected '}' after enum body.");

        return std::make_unique<EnumStmt>(std::move(name), std::move(variants));
    }